

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Template.hpp
# Opt level: O0

bool __thiscall
Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::isEqual
          (TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *this,
          QExpression *left,QExpression *right)

{
  bool bVar1;
  bool bVar2;
  QNumberType QVar3;
  bool bVar4;
  bool local_66;
  uint local_50;
  bool right_is_a_number;
  SizeT SStack_4c;
  bool left_is_a_number;
  SizeT right_length;
  SizeT left_length;
  char *right_content;
  char *left_content;
  Value<char> *right_value;
  Value<char> *left_value;
  QExpression *right_local;
  QExpression *left_local;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *this_local;
  
  right_value = (Value<char> *)0x0;
  left_content = (char *)0x0;
  right_content = (char *)0x0;
  _right_length = (char *)0x0;
  SStack_4c = 0;
  local_50 = 0;
  bVar4 = false;
  bVar1 = false;
  left_value = (Value<char> *)right;
  right_local = left;
  left_local = (QExpression *)this;
  if ((byte)(left->Type - RealNumber) < 3) {
    bVar4 = true;
  }
  else if (left->Type == Variable) {
    right_value = getValue(this,(VariableTag *)left);
    if (right_value == (Value<char> *)0x0) {
      return false;
    }
    QVar3 = Value<char>::GetNumberType(right_value);
    if (QVar3 == NotANumber) {
      bVar2 = Value<char>::SetCharAndLength<unsigned_int>
                        (right_value,&right_content,&stack0xffffffffffffffb4);
      if (!bVar2) {
        return false;
      }
    }
    else {
      bVar4 = true;
      QVar3 = Value<char>::SetNumber(right_value,(QNumber64 *)right_local);
      if (QVar3 == Real) {
        right_local->Type = RealNumber;
      }
      else if (QVar3 == Natural) {
        right_local->Type = NaturalNumber;
      }
      else if (QVar3 == Integer) {
        right_local->Type = IntegerNumber;
      }
    }
  }
  else {
    right_content = this->content_ + (left->field_0).SubExpressions.index_;
    SStack_4c = (left->field_0).SubExpressions.capacity_;
  }
  if ((byte)(left_value->field_0x11 - 1) < 3) {
    bVar1 = true;
  }
  else if (left_value->field_0x11 == '\x05') {
    left_content = (char *)getValue(this,(VariableTag *)left_value);
    if ((Value<char> *)left_content == (Value<char> *)0x0) {
      return false;
    }
    QVar3 = Value<char>::GetNumberType((Value<char> *)left_content);
    if (QVar3 == NotANumber) {
      bVar2 = Value<char>::SetCharAndLength<unsigned_int>
                        ((Value<char> *)left_content,(char **)&right_length,&local_50);
      if (!bVar2) {
        return false;
      }
    }
    else {
      bVar1 = true;
      QVar3 = Value<char>::SetNumber((Value<char> *)left_content,(QNumber64 *)left_value);
      if (QVar3 == Real) {
        left_value->field_0x11 = 1;
      }
      else if (QVar3 == Natural) {
        left_value->field_0x11 = 2;
      }
      else if (QVar3 == Integer) {
        left_value->field_0x11 = 3;
      }
    }
  }
  else {
    _right_length = this->content_ + (left_value->field_0).array_.index_;
    local_50 = (left_value->field_0).array_.capacity_;
    bVar1 = false;
  }
  if ((bVar4) || (bVar1)) {
    if (!bVar4) {
      if (right_value == (Value<char> *)0x0) {
        return false;
      }
      QVar3 = Value<char>::SetNumber(right_value,(QNumber64 *)right_local);
      if (QVar3 == Real) {
        right_local->Type = RealNumber;
      }
      else if (QVar3 == Natural) {
        right_local->Type = NaturalNumber;
      }
      else {
        if (QVar3 != Integer) {
          return false;
        }
        right_local->Type = IntegerNumber;
      }
    }
    if (!bVar1) {
      if (left_content == (char *)0x0) {
        return false;
      }
      QVar3 = Value<char>::SetNumber((Value<char> *)left_content,(QNumber64 *)left_value);
      if (QVar3 == Real) {
        left_value->field_0x11 = 1;
      }
      else if (QVar3 == Natural) {
        left_value->field_0x11 = 2;
      }
      else {
        if (QVar3 != Integer) {
          return false;
        }
        left_value->field_0x11 = 3;
      }
    }
    bVar4 = QExpression::operator==(right_local,(QExpression *)left_value);
    *(ulong *)&right_local->field_0 = (ulong)bVar4;
    right_local->Type = NaturalNumber;
  }
  else {
    local_66 = false;
    if (SStack_4c == local_50) {
      local_66 = StringUtils::IsEqual<char>(right_content,_right_length,local_50);
    }
    *(ulong *)&right_local->field_0 = (ulong)local_66;
    right_local->Type = NaturalNumber;
  }
  return true;
}

Assistant:

bool isEqual(QExpression &left, QExpression &right) const noexcept {
        const Value_T *left_value        = nullptr;
        const Value_T *right_value       = nullptr;
        const Char_T  *left_content      = nullptr;
        const Char_T  *right_content     = nullptr;
        SizeT          left_length       = 0;
        SizeT          right_length      = 0;
        bool           left_is_a_number  = false;
        bool           right_is_a_number = false;

        switch (left.Type) {
            case ExpressionType::RealNumber:
            case ExpressionType::NaturalNumber:
            case ExpressionType::IntegerNumber: {
                left_is_a_number = true;
                break;
            }

            case ExpressionType::Variable: {
                left_value = getValue(left.Variable);

                if (left_value != nullptr) {
                    if (left_value->GetNumberType() != QNumberType::NotANumber) {
                        left_is_a_number = true;

                        switch (left_value->SetNumber(left.Value.Number)) {
                            case QNumberType::Natural: {
                                left.Type = ExpressionType::NaturalNumber;
                                break;
                            }

                            case QNumberType::Integer: {
                                left.Type = ExpressionType::IntegerNumber;
                                break;
                            }

                            case QNumberType::Real: {
                                left.Type = ExpressionType::RealNumber;
                                break;
                            }

                            default: {
                            }
                        }
                    } else if (!(left_value->SetCharAndLength(left_content, left_length))) {
                        return false;
                    }

                    break;
                }

                return false;
            }

            default: {
                left_content = (content_ + left.Value.Offset);
                left_length  = left.Value.Length;
            }
        }

        switch (right.Type) {
            case ExpressionType::RealNumber:
            case ExpressionType::NaturalNumber:
            case ExpressionType::IntegerNumber: {
                right_is_a_number = true;
                break;
            }

            case ExpressionType::Variable: {
                right_value = getValue(right.Variable);

                if (right_value != nullptr) {
                    if (right_value->GetNumberType() != QNumberType::NotANumber) {
                        right_is_a_number = true;

                        switch (right_value->SetNumber(right.Value.Number)) {
                            case QNumberType::Natural: {
                                right.Type = ExpressionType::NaturalNumber;
                                break;
                            }

                            case QNumberType::Integer: {
                                right.Type = ExpressionType::IntegerNumber;
                                break;
                            }

                            case QNumberType::Real: {
                                right.Type = ExpressionType::RealNumber;
                                break;
                            }

                            default: {
                            }
                        }
                    } else if (!(right_value->SetCharAndLength(right_content, right_length))) {
                        return false;
                    }

                    break;
                }

                return false;
            }

            default: {
                right_content     = (content_ + right.Value.Offset);
                right_length      = right.Value.Length;
                right_is_a_number = false;
            }
        }

        if (left_is_a_number || right_is_a_number) {
            if (!left_is_a_number) {
                if (left_value != nullptr) {
                    switch (left_value->SetNumber(left.Value.Number)) {
                        case QNumberType::Natural: {
                            left.Type = ExpressionType::NaturalNumber;
                            break;
                        }

                        case QNumberType::Integer: {
                            left.Type = ExpressionType::IntegerNumber;
                            break;
                        }

                        case QNumberType::Real: {
                            left.Type = ExpressionType::RealNumber;
                            break;
                        }

                        default: {
                            return false;
                        }
                    }
                } else {
                    return false;
                }
            }

            if (!right_is_a_number) {
                if (right_value != nullptr) {
                    switch (right_value->SetNumber(right.Value.Number)) {
                        case QNumberType::Natural: {
                            right.Type = ExpressionType::NaturalNumber;
                            break;
                        }

                        case QNumberType::Integer: {
                            right.Type = ExpressionType::IntegerNumber;
                            break;
                        }

                        case QNumberType::Real: {
                            right.Type = ExpressionType::RealNumber;
                            break;
                        }

                        default: {
                            return false;
                        }
                    }
                } else {
                    return false;
                }
            }

            left.Value.Number.Natural = SizeT64(left == right);
            left.Type                 = ExpressionType::NaturalNumber;
            return true;
        }

        left.Value.Number.Natural =
            ((left_length == right_length) && StringUtils::IsEqual(left_content, right_content, right_length));
        left.Type = ExpressionType::NaturalNumber;

        return true;
    }